

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O0

int Cudd_bddIterConjDecomp(DdManager *dd,DdNode *f,DdNode ***conjuncts)

{
  int numVars;
  int iVar1;
  DdNode *pDVar2;
  DdNode *g;
  DdNode **ppDVar3;
  int nvars;
  int sizeNew;
  int sizeOld;
  DdNode *res [2];
  DdNode *old [2];
  DdNode *superset2;
  DdNode *superset1;
  DdNode ***conjuncts_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  numVars = Cudd_SupportSize(dd,f);
  res[1] = dd->one;
  *(int *)(((ulong)res[1] & 0xfffffffffffffffe) + 4) =
       *(int *)(((ulong)res[1] & 0xfffffffffffffffe) + 4) + 1;
  *(int *)(((ulong)f & 0xfffffffffffffffe) + 4) = *(int *)(((ulong)f & 0xfffffffffffffffe) + 4) + 1;
  nvars = Cudd_SharingSize(res + 1,2);
  old[0] = f;
  while( true ) {
    pDVar2 = Cudd_RemapOverApprox(dd,old[0],numVars,0,1.0);
    if (pDVar2 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,res[1]);
      Cudd_RecursiveDeref(dd,old[0]);
      return 0;
    }
    *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
    g = Cudd_bddSqueeze(dd,old[0],pDVar2);
    if (g == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,res[1]);
      Cudd_RecursiveDeref(dd,old[0]);
      Cudd_RecursiveDeref(dd,pDVar2);
      return 0;
    }
    *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(dd,pDVar2);
    _sizeNew = Cudd_bddAnd(dd,res[1],g);
    if (_sizeNew == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,g);
      Cudd_RecursiveDeref(dd,res[1]);
      Cudd_RecursiveDeref(dd,old[0]);
      return 0;
    }
    *(int *)(((ulong)_sizeNew & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)_sizeNew & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(dd,g);
    if (_sizeNew == res[1]) break;
    res[0] = Cudd_bddLICompaction(dd,old[0],_sizeNew);
    if (res[0] == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,res[1]);
      Cudd_RecursiveDeref(dd,old[0]);
      return 0;
    }
    *(int *)(((ulong)res[0] & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)res[0] & 0xfffffffffffffffe) + 4) + 1;
    iVar1 = Cudd_SharingSize((DdNode **)&sizeNew,2);
    if (nvars < iVar1) {
      Cudd_RecursiveDeref(dd,_sizeNew);
      Cudd_RecursiveDeref(dd,res[0]);
      goto LAB_009fa045;
    }
    Cudd_RecursiveDeref(dd,res[1]);
    res[1] = _sizeNew;
    Cudd_RecursiveDeref(dd,old[0]);
    old[0] = res[0];
    nvars = iVar1;
  }
  Cudd_RecursiveDeref(dd,_sizeNew);
LAB_009fa045:
  pDVar2 = Cudd_bddLICompaction(dd,res[1],old[0]);
  if (pDVar2 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,res[1]);
    Cudd_RecursiveDeref(dd,old[0]);
    return 0;
  }
  *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
       *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
  Cudd_RecursiveDeref(dd,res[1]);
  res[1] = pDVar2;
  if (pDVar2 == dd->one) {
    Cudd_RecursiveDeref(dd,pDVar2);
    ppDVar3 = (DdNode **)malloc(8);
    *conjuncts = ppDVar3;
    if (*conjuncts == (DdNode **)0x0) {
      Cudd_RecursiveDeref(dd,old[0]);
      dd->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
    **conjuncts = old[0];
    return 1;
  }
  if (old[0] == dd->one) {
    Cudd_RecursiveDeref(dd,old[0]);
    ppDVar3 = (DdNode **)malloc(8);
    *conjuncts = ppDVar3;
    if (*conjuncts == (DdNode **)0x0) {
      Cudd_RecursiveDeref(dd,res[1]);
      dd->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
    **conjuncts = res[1];
    return 1;
  }
  ppDVar3 = (DdNode **)malloc(0x10);
  *conjuncts = ppDVar3;
  if (*conjuncts == (DdNode **)0x0) {
    Cudd_RecursiveDeref(dd,res[1]);
    Cudd_RecursiveDeref(dd,old[0]);
    dd->errorCode = CUDD_MEMORY_OUT;
    return 0;
  }
  **conjuncts = res[1];
  (*conjuncts)[1] = old[0];
  return 2;
}

Assistant:

int
Cudd_bddIterConjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** conjuncts /* address of the array of conjuncts */)
{
    DdNode *superset1, *superset2, *old[2], *res[2];
    int sizeOld, sizeNew;
    int nvars = Cudd_SupportSize(dd,f);

    old[0] = DD_ONE(dd);
    cuddRef(old[0]);
    old[1] = f;
    cuddRef(old[1]);
    sizeOld = Cudd_SharingSize(old,2);

    do {
        /* Find a tentative first factor by overapproximation and
        ** minimization. */
        superset1 = Cudd_RemapOverApprox(dd,old[1],nvars,0,1.0);
        if (superset1 == NULL) {
            Cudd_RecursiveDeref(dd,old[0]);
            Cudd_RecursiveDeref(dd,old[1]);
            return(0);
        }
        cuddRef(superset1);
        superset2 = Cudd_bddSqueeze(dd,old[1],superset1);
        if (superset2 == NULL) {
            Cudd_RecursiveDeref(dd,old[0]);
            Cudd_RecursiveDeref(dd,old[1]);
            Cudd_RecursiveDeref(dd,superset1);
            return(0);
        }
        cuddRef(superset2);
        Cudd_RecursiveDeref(dd,superset1);
        res[0] = Cudd_bddAnd(dd,old[0],superset2);
        if (res[0] == NULL) {
            Cudd_RecursiveDeref(dd,superset2);
            Cudd_RecursiveDeref(dd,old[0]);
            Cudd_RecursiveDeref(dd,old[1]);
            return(0);
        }
        cuddRef(res[0]);
        Cudd_RecursiveDeref(dd,superset2);
        if (res[0] == old[0]) {
            Cudd_RecursiveDeref(dd,res[0]);
            break;      /* avoid infinite loop */
        }

        /* Compute the second factor by minimization. */
        res[1] = Cudd_bddLICompaction(dd,old[1],res[0]);
        if (res[1] == NULL) {
            Cudd_RecursiveDeref(dd,old[0]);
            Cudd_RecursiveDeref(dd,old[1]);
            return(0);
        }
        cuddRef(res[1]);

        sizeNew = Cudd_SharingSize(res,2);
        if (sizeNew <= sizeOld) {
            Cudd_RecursiveDeref(dd,old[0]);
            old[0] = res[0];
            Cudd_RecursiveDeref(dd,old[1]);
            old[1] = res[1];
            sizeOld = sizeNew;
        } else {
            Cudd_RecursiveDeref(dd,res[0]);
            Cudd_RecursiveDeref(dd,res[1]);
            break;
        }

    } while (1);

    /* Refine the first factor by minimization. If h turns out to
    ** be f, this step guarantees that g will be 1. */
    superset1 = Cudd_bddLICompaction(dd,old[0],old[1]);
    if (superset1 == NULL) {
        Cudd_RecursiveDeref(dd,old[0]);
        Cudd_RecursiveDeref(dd,old[1]);
        return(0);
    }
    cuddRef(superset1);
    Cudd_RecursiveDeref(dd,old[0]);
    old[0] = superset1;

    if (old[0] != DD_ONE(dd)) {
        if (old[1] != DD_ONE(dd)) {
            *conjuncts = ABC_ALLOC(DdNode *,2);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,old[0]);
                Cudd_RecursiveDeref(dd,old[1]);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = old[0];
            (*conjuncts)[1] = old[1];
            return(2);
        } else {
            Cudd_RecursiveDeref(dd,old[1]);
            *conjuncts = ABC_ALLOC(DdNode *,1);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,old[0]);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = old[0];
            return(1);
        }
    } else {
        Cudd_RecursiveDeref(dd,old[0]);
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            Cudd_RecursiveDeref(dd,old[1]);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = old[1];
        return(1);
    }

}